

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall
Random_keys::cruzamento5
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  double *pdVar1;
  pointer __first;
  pointer __last;
  int iVar2;
  ulong uVar3;
  reference ppCVar4;
  size_type sVar5;
  unsigned_long i_2;
  ulong __n;
  unsigned_long i;
  size_type __n_00;
  double dVar6;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  __last = RK_Individual::cromossomos.
           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = time((time_t *)0x0);
  local_38._M_x = uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__first,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__last,&local_38);
  dVar6 = round((double)(int)((ulong)((long)RK_Individual::cromossomos.
                                            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)RK_Individual::cromossomos.
                                           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0.4);
  sVar5 = (size_type)(int)dVar6;
  for (__n_00 = 0; uVar3 = sVar5, sVar5 != __n_00; __n_00 = __n_00 + 1) {
    pdVar1 = pai1->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n_00);
    dVar6 = pdVar1[(*ppCVar4)->position];
    pdVar1 = filho->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n_00);
    pdVar1[(*ppCVar4)->position] = dVar6;
  }
  for (; __n = ((long)RK_Individual::cromossomos.
                      super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)RK_Individual::cromossomos.
                      super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) - sVar5, uVar3 < __n; uVar3 = uVar3 + 1
      ) {
    pdVar1 = pai2->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,uVar3);
    dVar6 = pdVar1[(*ppCVar4)->position];
    pdVar1 = filho->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,uVar3);
    pdVar1[(*ppCVar4)->position] = dVar6;
  }
  for (; __n < (ulong)((long)RK_Individual::cromossomos.
                             super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)RK_Individual::cromossomos.
                             super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    iVar2 = rand();
    pdVar1 = filho->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n);
    pdVar1[(*ppCVar4)->position] = (double)(iVar2 % 100);
  }
  return;
}

Assistant:

void Random_keys::cruzamento5(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    int tam = RK_Individual::cromossomos.size();

    int tam04 = round(0.4*tam);

    //40% vem do pai1
    for(unsigned long int i=0; i<tam04; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai1->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //40% vem do pai12
    for(unsigned long int i=tam04; i<RK_Individual::cromossomos.size()-tam04; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai2->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //20% gerado de forma aleatoria
    for(unsigned long int i=RK_Individual::cromossomos.size()-tam04; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = rand() % 100;

}